

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlTextMerge(xmlNodePtr first,xmlNodePtr second)

{
  xmlNodePtr pxVar1;
  
  pxVar1 = second;
  if ((((first != (xmlNodePtr)0x0) && (pxVar1 = first, second != (xmlNodePtr)0x0)) &&
      (first->type == XML_TEXT_NODE)) &&
     ((second->type == XML_TEXT_NODE && (second->name == first->name)))) {
    xmlNodeAddContent(first,second->content);
    xmlUnlinkNode(second);
    xmlFreeNode(second);
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlTextMerge(xmlNodePtr first, xmlNodePtr second) {
    if (first == NULL) return(second);
    if (second == NULL) return(first);
    if (first->type != XML_TEXT_NODE) return(first);
    if (second->type != XML_TEXT_NODE) return(first);
    if (second->name != first->name)
	return(first);
    xmlNodeAddContent(first, second->content);
    xmlUnlinkNode(second);
    xmlFreeNode(second);
    return(first);
}